

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::default_value_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  float fVar1;
  double d;
  bool bVar2;
  string *psVar3;
  ushort *puVar4;
  Descriptor *pDVar5;
  Nonnull<char_*> pcVar6;
  char *pcVar7;
  EnumValueDescriptor *pEVar8;
  AlphaNum *in_RCX;
  EnumDescriptor *descriptor_00;
  char *pcVar9;
  AlphaNum *c;
  char *in_R9;
  csharp *this_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string_view enum_name;
  string_view enum_value_name;
  LogMessage local_f0;
  undefined1 local_e0 [32];
  string local_c0;
  AlphaNum local_a0;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [48];
  
LAB_00318515:
  switch(descriptor->type_) {
  case '\x01':
    goto switchD_0031852c_caseD_1;
  case '\x02':
    fVar1 = (descriptor->field_20).default_value_float_;
    if (INFINITY <= fVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "float.PositiveInfinity";
      pcVar7 = "";
      goto LAB_0031865c;
    }
    if (fVar1 <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "float.NegativeInfinity";
      pcVar7 = "";
      goto LAB_0031865c;
    }
    if (!NAN(fVar1)) {
      local_f0._0_8_ =
           absl::lts_20250127::numbers_internal::SixDigitsToBuffer((double)fVar1,local_e0);
      local_a0.piece_._M_len = 1;
      local_a0.piece_._M_str = "F";
      goto LAB_0031861a;
    }
LAB_00318908:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "float.NaN";
    pcVar7 = "";
    goto LAB_0031865c;
  case '\x03':
  case '\x10':
  case '\x12':
    pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((descriptor->field_20).default_value_int64_t_,local_e0);
    local_f0._0_8_ = (long)pcVar6 - (long)local_e0;
    local_a0.piece_._M_len = 1;
    local_a0.piece_._M_str = "L";
    goto LAB_0031861a;
  case '\x04':
  case '\x06':
    pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((descriptor->field_20).default_value_uint64_t_,local_e0);
    local_f0._0_8_ = (long)pcVar6 - (long)local_e0;
    local_a0.piece_._M_len = 2;
    local_a0.piece_._M_str = "UL";
    goto LAB_0031861a;
  case '\x05':
  case '\x0f':
  case '\x11':
    pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((descriptor->field_20).default_value_int32_t_,local_e0);
    break;
  case '\a':
  case '\r':
    pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((descriptor->field_20).default_value_uint32_t_,local_e0);
    break;
  case '\b':
    bVar2 = (descriptor->field_20).default_value_bool_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar2 == true) {
      pcVar9 = "true";
      pcVar7 = "";
    }
    else {
      pcVar9 = "false";
      pcVar7 = "";
    }
    goto LAB_0031865c;
  case '\t':
    GetStringDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,descriptor);
    return __return_storage_ptr__;
  case '\n':
switchD_0031852c_caseD_a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "null";
    pcVar7 = "";
    goto LAB_0031865c;
  case '\v':
    pDVar5 = FieldDescriptor::message_type(descriptor);
    psVar3 = pDVar5->file_->name_;
    if (psVar3->_M_string_length != 0x1e) goto switchD_0031852c_caseD_a;
    pcVar7 = (psVar3->_M_dataplus)._M_p;
    auVar10[0] = -(*pcVar7 == 'g');
    auVar10[1] = -(pcVar7[1] == 'o');
    auVar10[2] = -(pcVar7[2] == 'o');
    auVar10[3] = -(pcVar7[3] == 'g');
    auVar10[4] = -(pcVar7[4] == 'l');
    auVar10[5] = -(pcVar7[5] == 'e');
    auVar10[6] = -(pcVar7[6] == '/');
    auVar10[7] = -(pcVar7[7] == 'p');
    auVar10[8] = -(pcVar7[8] == 'r');
    auVar10[9] = -(pcVar7[9] == 'o');
    auVar10[10] = -(pcVar7[10] == 't');
    auVar10[0xb] = -(pcVar7[0xb] == 'o');
    auVar10[0xc] = -(pcVar7[0xc] == 'b');
    auVar10[0xd] = -(pcVar7[0xd] == 'u');
    auVar10[0xe] = -(pcVar7[0xe] == 'f');
    auVar10[0xf] = -(pcVar7[0xf] == '/');
    auVar11[0] = -(pcVar7[0xe] == 'f');
    auVar11[1] = -(pcVar7[0xf] == '/');
    auVar11[2] = -(pcVar7[0x10] == 'w');
    auVar11[3] = -(pcVar7[0x11] == 'r');
    auVar11[4] = -(pcVar7[0x12] == 'a');
    auVar11[5] = -(pcVar7[0x13] == 'p');
    auVar11[6] = -(pcVar7[0x14] == 'p');
    auVar11[7] = -(pcVar7[0x15] == 'e');
    auVar11[8] = -(pcVar7[0x16] == 'r');
    auVar11[9] = -(pcVar7[0x17] == 's');
    auVar11[10] = -(pcVar7[0x18] == '.');
    auVar11[0xb] = -(pcVar7[0x19] == 'p');
    auVar11[0xc] = -(pcVar7[0x1a] == 'r');
    auVar11[0xd] = -(pcVar7[0x1b] == 'o');
    auVar11[0xe] = -(pcVar7[0x1c] == 't');
    auVar11[0xf] = -(pcVar7[0x1d] == 'o');
    auVar11 = auVar11 & auVar10;
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) goto switchD_0031852c_caseD_a;
    pDVar5 = FieldDescriptor::message_type(descriptor);
    if (pDVar5->field_count_ < 1) {
      default_value_abi_cxx11_();
      goto LAB_00318908;
    }
    descriptor = pDVar5->fields_;
    goto LAB_00318515;
  case '\f':
    GetBytesDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,descriptor);
    return __return_storage_ptr__;
  case '\x0e':
    pEVar8 = FieldDescriptor::default_value_enum(descriptor);
    GetClassName_abi_cxx11_((string *)local_70,(csharp *)pEVar8->type_,descriptor_00);
    local_f0._0_8_ = local_70._8_8_;
    local_f0.data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )local_70._0_8_;
    local_a0.piece_._M_len = 1;
    local_a0.piece_._M_str = ".";
    pEVar8 = FieldDescriptor::default_value_enum(descriptor);
    puVar4 = (ushort *)(pEVar8->type_->all_names_).payload_;
    this_00 = (csharp *)(ulong)*puVar4;
    pEVar8 = FieldDescriptor::default_value_enum(descriptor);
    c = (AlphaNum *)(pEVar8->all_names_->_M_dataplus)._M_p;
    enum_name._M_str = (char *)pEVar8->all_names_->_M_string_length;
    enum_name._M_len = (long)puVar4 + ~(ulong)this_00;
    enum_value_name._M_str = in_R9;
    enum_value_name._M_len = (size_t)c;
    GetEnumValueName_abi_cxx11_(&local_c0,this_00,enum_name,enum_value_name);
    local_50._0_8_ = local_c0._M_string_length;
    local_50._8_8_ = local_c0._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_f0,&local_a0,(AlphaNum *)local_50,c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((LogMessageData *)local_70._0_8_ == (LogMessageData *)(local_70 + 0x10)) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_70._0_8_,local_60._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x195);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_f0,(char (*) [20])"Unknown field type.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_f0);
  }
  pcVar9 = local_e0;
  local_f0._0_8_ = (long)pcVar7 - (long)pcVar9;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_f0.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )pcVar9;
  goto LAB_0031865c;
switchD_0031852c_caseD_1:
  d = (descriptor->field_20).default_value_double_;
  if (d < INFINITY) {
    if (-INFINITY < d) {
      if (!NAN(d)) {
        local_f0._0_8_ = absl::lts_20250127::numbers_internal::SixDigitsToBuffer(d,local_e0);
        local_a0.piece_._M_len = 1;
        local_a0.piece_._M_str = "D";
LAB_0031861a:
        local_f0.data_._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
              )local_e0;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(lts_20250127 *)&local_f0,&local_a0,in_RCX);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "double.NaN";
      pcVar7 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "double.NegativeInfinity";
      pcVar7 = "";
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "double.PositiveInfinity";
    pcVar7 = "";
  }
LAB_0031865c:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::default_value(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return absl::StrCat(
          GetClassName(descriptor->default_value_enum()->type()), ".",
          GetEnumValueName(descriptor->default_value_enum()->type()->name(),
                           descriptor->default_value_enum()->name()));
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
        return default_value(wrapped_field);
      } else {
        return "null";
      }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value = descriptor->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "double.PositiveInfinity";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "double.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "double.NaN";
      }
      return absl::StrCat(value, "D");
    }
    case FieldDescriptor::TYPE_FLOAT: {
      float value = descriptor->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "float.PositiveInfinity";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "float.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "float.NaN";
      }
      return absl::StrCat(value, "F");
    }
    case FieldDescriptor::TYPE_INT64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    case FieldDescriptor::TYPE_UINT64:
      return absl::StrCat(descriptor->default_value_uint64(), "UL");
    case FieldDescriptor::TYPE_INT32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_FIXED64:
      return absl::StrCat(descriptor->default_value_uint64(), "UL");
    case FieldDescriptor::TYPE_FIXED32:
      return absl::StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_BOOL:
      if (descriptor->default_value_bool()) {
        return "true";
      } else {
        return "false";
      }
    case FieldDescriptor::TYPE_STRING:
      return GetStringDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_BYTES:
      return GetBytesDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_UINT32:
      return absl::StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_SFIXED32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SFIXED64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    case FieldDescriptor::TYPE_SINT32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SINT64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    default:
      ABSL_LOG(FATAL) << "Unknown field type.";
      return "";
  }
}